

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Texture2DMipmapCase::init(Texture2DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  Texture2D *this_01;
  Texture2D *pTVar2;
  PixelBufferAccess *access;
  RGBA local_78;
  Vec4 local_74;
  uint local_64;
  uint local_60;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int numLevels;
  allocator<char> local_31;
  string local_30;
  Texture2DMipmapCase *local_10;
  Texture2DMipmapCase *this_local;
  
  local_10 = this;
  if (this->m_coordType == COORDTYPE_PROJECTED) {
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar1 = tcu::RenderTarget::getNumSamples((RenderTarget *)CONCAT44(extraout_var,iVar1));
    if (0 < iVar1) {
      levelNdx._3_1_ = 1;
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "Projected lookup validation not supported in multisample config",&local_31);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
      levelNdx._3_1_ = 0;
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_01 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_01;
  iVar1 = de::max<int>(this->m_width,this->m_height);
  iVar1 = ::deLog2Floor32(iVar1);
  step = iVar1 + 1;
  for (inc = 0; (int)inc < (int)step; inc = inc + 1) {
    dec = (deUint32)(0xff / (long)(int)(step - 1));
    rgb = ::deClamp32(dec * inc,0,0xff);
    color = 0xff - rgb;
    local_64 = rgb << 0x10 | color * 0x100;
    local_60 = local_64 | 0xff;
    local_64 = local_64 | 0xff0000ff;
    pTVar2 = glu::Texture2D::getRefTexture(this->m_texture);
    tcu::Texture2D::allocLevel(pTVar2,inc);
    pTVar2 = glu::Texture2D::getRefTexture(this->m_texture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar2->super_TextureLevelPyramid,inc);
    tcu::RGBA::RGBA(&local_78,local_64);
    tcu::RGBA::toVec((RGBA *)&local_74);
    tcu::clear(access,&local_74);
  }
  return inc;
}

Assistant:

void Texture2DMipmapCase::init (void)
{
	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = deLog2Floor32(de::max(m_width, m_height))+1;

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}